

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_ostream.hpp
# Opt level: O0

ostream * __thiscall
boost::unit_test::
lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
::operator()(lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
             *this,ostream *ostr)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  undefined8 in_RSI;
  long in_RDI;
  basic_cstring<const_char> *in_stack_00000048;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000050;
  
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),in_RSI);
  pbVar1 = unit_test::operator<<(in_stack_00000050,in_stack_00000048);
  return pbVar1;
}

Assistant:

virtual std::ostream&   operator()( std::ostream& ostr ) const
    {
        return m_prev(ostr) << m_value;
    }